

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::Image::printSearchPath(void)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  int iVar3;
  long lVar4;
  
  lVar1 = engine;
  lVar4 = (long)imageModuleOffset;
  if (0 < *(int *)(engine + 8 + lVar4)) {
    __s = *(char **)(engine + lVar4);
    iVar3 = 0;
    do {
      puts(__s);
      sVar2 = strlen(__s);
      __s = __s + sVar2 + 1;
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)(lVar1 + 8 + lVar4));
  }
  return;
}

Assistant:

void
Image::printSearchPath(void)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	char *p = g->searchPaths;
	for(int i = 0; i < g->numSearchPaths; i++){
		printf("%s\n", p);
		p += strlen(p) + 1;
	}
}